

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_token_stream.c
# Opt level: O1

l2_token * l2_token_stream_next_token(l2_token_stream *token_stream_p)

{
  int cols;
  l2_char_stream *char_stream_p;
  int iVar1;
  byte bVar2;
  boolean bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  l2_token *plVar7;
  undefined7 extraout_var;
  l2_token *extraout_RAX;
  char *pcVar8;
  l2_token *extraout_RAX_00;
  l2_token *extraout_RAX_01;
  l2_token *extraout_RAX_02;
  l2_token *extraout_RAX_03;
  l2_token *extraout_RAX_04;
  l2_token *extraout_RAX_05;
  l2_token *extraout_RAX_06;
  l2_token *extraout_RAX_07;
  l2_token *extraout_RAX_08;
  l2_token *extraout_RAX_09;
  l2_token *extraout_RAX_10;
  l2_token *extraout_RAX_11;
  l2_token *extraout_RAX_12;
  l2_token *extraout_RAX_13;
  l2_token *extraout_RAX_14;
  l2_token *extraout_RAX_15;
  l2_token *extraout_RAX_16;
  undefined7 extraout_var_00;
  l2_token *extraout_RAX_17;
  l2_token *extraout_RAX_18;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  undefined7 extraout_var_05;
  undefined7 extraout_var_06;
  undefined7 extraout_var_07;
  undefined7 extraout_var_08;
  undefined7 extraout_var_09;
  undefined7 extraout_var_10;
  undefined7 extraout_var_11;
  undefined7 extraout_var_12;
  undefined7 extraout_var_13;
  undefined7 extraout_var_14;
  undefined7 extraout_var_15;
  l2_token *extraout_RAX_19;
  l2_token *extraout_RAX_20;
  uint uVar9;
  ulong uVar10;
  l2_parsing_error_type lVar11;
  long lVar12;
  int iVar13;
  char seq [4];
  l2_string token_str_buff;
  l2_token t;
  byte local_84 [4];
  l2_string local_80;
  undefined4 local_68;
  undefined4 uStack_64;
  l2_string lStack_60;
  undefined8 local_48;
  undefined8 uStack_40;
  
  l2_assert_func((long)token_stream_p,L2_INTERNAL_ERROR_NULL_POINTER,"l2_token_stream_next_token",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/AloneCafe[P]l2/l2_parser/l2_token_stream.c"
                 ,0x35);
  iVar5 = token_stream_p->token_vector_current_pos;
  if ((ulong)(long)iVar5 < (token_stream_p->token_vector).size) {
    token_stream_p->token_vector_current_pos = iVar5 + 1;
    plVar7 = (l2_token *)l2_vector_at(&token_stream_p->token_vector,iVar5);
    return plVar7;
  }
  local_48 = 0;
  uStack_40 = 0;
  lStack_60.len = 0;
  lStack_60.max_len = 0;
  local_68 = 0;
  uStack_64 = 0;
  lStack_60.str_p = (char *)0x0;
  l2_string_create(&local_80);
  uVar6 = 0;
  do {
    bVar2 = l2_char_stream_next_char(token_stream_p->char_stream_p);
    plVar7 = (l2_token *)CONCAT71(extraout_var,bVar2);
    char_stream_p = token_stream_p->char_stream_p;
    iVar5 = char_stream_p->lines;
    cols = char_stream_p->cols;
    if (0x30 < uVar6) {
      if (uVar6 < 0x50) {
        if (uVar6 == 0x31) {
          if (9 < (byte)(bVar2 - 0x30)) {
            lVar11 = L2_PARSING_ERROR_INCOMPLETE_REAL_LITERAL;
            goto LAB_001032f3;
          }
LAB_0010278d:
          l2_string_push_char(&local_80,bVar2);
          uVar6 = 0x32;
          plVar7 = extraout_RAX_07;
          goto LAB_00102997;
        }
        if (uVar6 == 0x32) {
          if ((byte)(bVar2 - 0x30) < 10) goto LAB_0010278d;
          pcVar8 = l2_string_get_str_p(&local_80);
          lStack_60.str_p = (char *)l2_cast_real_str_to_int(pcVar8);
          l2_char_stream_rollback(token_stream_p->char_stream_p);
          iVar13 = 5;
          uVar6 = 0x32;
          plVar7 = extraout_RAX_04;
        }
        else {
          iVar13 = 0;
          if (uVar6 == 0x40) {
            if (bVar2 < 0x62) {
              if (bVar2 < 0x3f) {
                if (bVar2 == 0x22) {
                  bVar2 = 0x22;
                }
                else {
                  if (bVar2 != 0x27) goto switchD_001028f6_caseD_6f;
                  bVar2 = 0x27;
                }
              }
              else if (bVar2 == 0x3f) {
                bVar2 = 0x3f;
              }
              else if (bVar2 == 0x5c) {
                bVar2 = 0x5c;
              }
              else {
                if (bVar2 != 0x61) goto switchD_001028f6_caseD_6f;
                bVar2 = 7;
              }
            }
            else {
              switch(bVar2) {
              case 0x6e:
                bVar2 = 10;
                break;
              case 0x6f:
              case 0x70:
              case 0x71:
              case 0x73:
              case 0x75:
switchD_001028f6_caseD_6f:
                if ((bVar2 & 0xf8) == 0x30) {
                  lVar12 = 1;
                  do {
                    bVar2 = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if ((bVar2 & 0xf8) != 0x30) {
                      local_84[lVar12] = 0;
                      l2_char_stream_rollback(token_stream_p->char_stream_p);
                      goto LAB_00102d23;
                    }
                    local_84[lVar12] = bVar2;
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 3);
                  lVar12 = 3;
LAB_00102d23:
                  local_84[lVar12] = 0;
                  iVar5 = l2_cast_octal_str_to_int((char *)local_84);
                  bVar2 = (byte)iVar5;
                }
                else {
                  if (bVar2 != 0x78) {
                    if (bVar2 == 0xff) goto LAB_001032bd;
                    local_84[1] = 0;
                    iVar13 = 0;
                    local_84[0] = bVar2;
                    l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE,iVar5,cols,
                                       local_84);
                    l2_string_push_char(&local_80,bVar2);
                    plVar7 = extraout_RAX_18;
                    goto LAB_001026ea;
                  }
                  local_84[0] = l2_char_stream_next_char(char_stream_p);
                  local_84[1] = 0;
                  if ((9 < (byte)(local_84[0] - 0x30)) &&
                     ((0x25 < local_84[0] - 0x41 ||
                      ((0x3f0000003fU >> ((ulong)(local_84[0] - 0x41) & 0x3f) & 1) == 0)))) {
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE,iVar5,cols,
                                       local_84);
                    l2_string_push_char(&local_80,local_84[0]);
                  }
                  local_84[1] = l2_char_stream_next_char(token_stream_p->char_stream_p);
                  if ((9 < (byte)(local_84[1] - 0x30)) &&
                     ((0x25 < local_84[1] - 0x41 ||
                      ((0x3f0000003fU >> ((ulong)(local_84[1] - 0x41) & 0x3f) & 1) == 0)))) {
                    local_84[1] = 0;
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    uVar6 = 0x40;
                    plVar7 = extraout_RAX_20;
                    goto LAB_00102997;
                  }
                  local_84[2] = 0;
                  iVar5 = l2_cast_hex_str_to_int((char *)local_84);
                  bVar2 = (byte)iVar5;
                }
                break;
              case 0x72:
                bVar2 = 0xd;
                break;
              case 0x74:
                bVar2 = 9;
                break;
              case 0x76:
                bVar2 = 0xb;
                break;
              default:
                if (bVar2 == 0x62) {
                  bVar2 = 8;
                }
                else {
                  if (bVar2 != 0x66) goto switchD_001028f6_caseD_6f;
                  bVar2 = 0xc;
                }
              }
            }
LAB_0010260d:
            l2_string_push_char(&local_80,bVar2);
            uVar6 = 0x400;
            plVar7 = extraout_RAX_01;
            goto LAB_00102997;
          }
        }
      }
      else {
        if (uVar6 < 0x400) {
          if (uVar6 != 0x50) {
            iVar13 = 0;
            if (uVar6 == 0x200) {
              if (((byte)(bVar2 - 0x30) < 10) ||
                 ((bVar2 - 0x41 < 0x26 &&
                  ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) != 0)))) goto LAB_0010264a;
              pcVar8 = l2_string_get_str_p(&local_80);
              iVar5 = l2_cast_hex_str_to_int(pcVar8 + 2);
              lStack_60.str_p = (char *)CONCAT44(lStack_60.str_p._4_4_,iVar5);
              l2_char_stream_rollback(token_stream_p->char_stream_p);
              iVar13 = 5;
              uVar6 = 0x200;
              plVar7 = extraout_RAX;
            }
            goto LAB_0010299a;
          }
          if (bVar2 < 0x62) {
            if (bVar2 < 0x3f) {
              if (bVar2 == 0x22) {
                bVar2 = 0x22;
              }
              else {
                if (bVar2 != 0x27) goto switchD_001028cb_caseD_6f;
                bVar2 = 0x27;
              }
            }
            else if (bVar2 == 0x3f) {
              bVar2 = 0x3f;
            }
            else if (bVar2 == 0x5c) {
              bVar2 = 0x5c;
            }
            else {
              if (bVar2 != 0x61) goto switchD_001028cb_caseD_6f;
              bVar2 = 7;
            }
          }
          else {
            switch(bVar2) {
            case 0x6e:
              bVar2 = 10;
              break;
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
            case 0x75:
switchD_001028cb_caseD_6f:
              if ((bVar2 & 0xf8) == 0x30) {
                lVar12 = 1;
                do {
                  bVar2 = l2_char_stream_next_char(token_stream_p->char_stream_p);
                  if ((bVar2 & 0xf8) != 0x30) {
                    local_84[lVar12] = 0;
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto LAB_00102cff;
                  }
                  local_84[lVar12] = bVar2;
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 3);
                lVar12 = 3;
LAB_00102cff:
                local_84[lVar12] = 0;
                iVar5 = l2_cast_octal_str_to_int((char *)local_84);
                bVar2 = (byte)iVar5;
              }
              else {
                if (bVar2 != 0x78) {
                  if (bVar2 == 0xff) goto LAB_001032e7;
                  local_84[1] = 0;
                  iVar13 = 0;
                  local_84[0] = bVar2;
                  l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE,iVar5,cols,local_84)
                  ;
                  l2_string_push_char(&local_80,bVar2);
                  plVar7 = extraout_RAX_17;
                  goto LAB_00102927;
                }
                local_84[0] = l2_char_stream_next_char(char_stream_p);
                local_84[1] = 0;
                if ((9 < (byte)(local_84[0] - 0x30)) &&
                   ((0x25 < local_84[0] - 0x41 ||
                    ((0x3f0000003fU >> ((ulong)(local_84[0] - 0x41) & 0x3f) & 1) == 0)))) {
                  l2_char_stream_rollback(token_stream_p->char_stream_p);
                  l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE,iVar5,cols,local_84)
                  ;
                  l2_string_push_char(&local_80,local_84[0]);
                }
                local_84[1] = l2_char_stream_next_char(token_stream_p->char_stream_p);
                if (((byte)(local_84[1] - 0x30) < 10) ||
                   ((local_84[1] - 0x41 < 0x26 &&
                    ((0x3f0000003fU >> ((ulong)(local_84[1] - 0x41) & 0x3f) & 1) != 0)))) {
                  local_84[2] = 0;
                }
                else {
                  local_84[1] = 0;
                  l2_char_stream_rollback(token_stream_p->char_stream_p);
                }
                iVar5 = l2_cast_hex_str_to_int((char *)local_84);
                bVar2 = (byte)iVar5;
              }
              break;
            case 0x72:
              bVar2 = 0xd;
              break;
            case 0x74:
              bVar2 = 9;
              break;
            case 0x76:
              bVar2 = 0xb;
              break;
            default:
              if (bVar2 == 0x62) {
                bVar2 = 8;
              }
              else {
                if (bVar2 != 0x66) goto switchD_001028cb_caseD_6f;
                bVar2 = 0xc;
              }
            }
          }
LAB_001027dd:
          l2_string_push_char(&local_80,bVar2);
          uVar6 = 0x500;
          plVar7 = extraout_RAX_08;
          goto LAB_00102997;
        }
        if (uVar6 == 0x400) {
          if (bVar2 != 0x27) {
            if (bVar2 != 0xff) {
              lVar11 = L2_PARSING_ERROR_MULTI_CHARACTER_IN_SINGLE_CHARACTER_LITERAL;
              goto LAB_001032f3;
            }
            goto LAB_001032bd;
          }
          pcVar8 = l2_string_get_str_p(&local_80);
          plVar7 = (l2_token *)(ulong)(uint)(int)*pcVar8;
          lStack_60.str_p = (char *)CONCAT44(lStack_60.str_p._4_4_,(int)*pcVar8);
          iVar13 = 5;
LAB_001026ea:
          uVar6 = 0x400;
          goto LAB_0010299a;
        }
        iVar13 = 0;
        if (uVar6 != 0x500) goto LAB_0010299a;
        if (bVar2 != 0x22) goto LAB_001027c0;
        l2_string_create(&lStack_60);
        l2_string_strcpy(&lStack_60,&local_80);
        iVar13 = 5;
        plVar7 = extraout_RAX_11;
LAB_00102927:
        uVar6 = 0x500;
      }
      goto LAB_0010299a;
    }
    if (5 < uVar6) {
      if (uVar6 != 0x20) {
        iVar13 = 0;
        if (uVar6 == 0x21) {
          if ((byte)(bVar2 - 0x30) < 10) goto LAB_001027fa;
          pcVar8 = l2_string_get_str_p(&local_80);
          iVar5 = l2_cast_octal_str_to_int(pcVar8 + 1);
          lStack_60.str_p = (char *)CONCAT44(lStack_60.str_p._4_4_,iVar5);
          l2_char_stream_rollback(token_stream_p->char_stream_p);
          iVar13 = 5;
          uVar6 = 0x21;
          plVar7 = extraout_RAX_00;
        }
        goto LAB_0010299a;
      }
      if ((9 < (byte)(bVar2 - 0x30)) &&
         ((0x25 < bVar2 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) == 0)))) {
        lVar11 = L2_PARSING_ERROR_INCOMPLETE_HEX_LITERAL;
        goto LAB_001032f3;
      }
LAB_0010264a:
      l2_string_push_char(&local_80,bVar2);
      uVar6 = 0x200;
      plVar7 = extraout_RAX_02;
      goto LAB_00102997;
    }
    plVar7 = (l2_token *)
             ((long)&switchD_0010240e::switchdataD_0010c434 +
             (long)(int)(&switchD_0010240e::switchdataD_0010c434)[uVar6]);
    switch(uVar6) {
    case 0:
      uStack_40 = CONCAT44(uStack_40._4_4_,cols);
      local_48 = CONCAT44(iVar5,char_stream_p->chars_vector_current_pos);
      if (((byte)(bVar2 + 0xbf) < 0x1a) || (bVar2 == 0x5f || (byte)(bVar2 + 0x9f) < 0x1a)) {
        local_68 = 2;
LAB_00102767:
        l2_string_push_char(&local_80,bVar2);
        uVar6 = 1;
        plVar7 = extraout_RAX_06;
        goto LAB_00102997;
      }
      if (bVar2 == 0x30) {
        local_68 = 3;
        l2_string_push_char(&local_80,'0');
        uVar6 = 2;
        plVar7 = extraout_RAX_14;
        goto LAB_00102997;
      }
      if ((byte)(bVar2 - 0x31) < 9) {
        local_68 = 3;
        goto LAB_00102741;
      }
      plVar7 = (l2_token *)(ulong)bVar2;
      iVar13 = 0;
      uVar6 = (uint)bVar2;
      if (0x5c < uVar6) {
        if (uVar6 < 0x7b) {
          if (uVar6 == 0x5d) {
            local_68 = 0xb;
          }
          else {
            if (uVar6 != 0x5e) goto switchD_00102c3c_caseD_b;
            local_68 = 0x20;
            cVar4 = l2_char_stream_next_char(char_stream_p);
            plVar7 = (l2_token *)CONCAT71(extraout_var_01,cVar4);
            if (cVar4 != '=') goto LAB_00103164;
            local_68 = 0x30;
          }
        }
        else {
          uVar9 = bVar2 - 0x7b;
          if (uVar9 < 4) {
            plVar7 = (l2_token *)
                     ((long)&switchD_00102e63::switchdataD_0010c570 +
                     (long)(int)(&switchD_00102e63::switchdataD_0010c570)[uVar9]);
            switch((uint)bVar2) {
            case 0x7b:
              local_68 = 6;
              break;
            case 0x7c:
              local_68 = 0x21;
              bVar2 = l2_char_stream_next_char(char_stream_p);
              plVar7 = (l2_token *)CONCAT71(extraout_var_02,bVar2);
              if (bVar2 == 0x3d) {
                local_68 = 0x31;
              }
              else {
                plVar7 = (l2_token *)(ulong)bVar2;
                if (bVar2 != 0x7c) goto LAB_00103164;
                local_68 = 0x23;
              }
              break;
            case 0x7d:
              local_68 = 7;
              break;
            case 0x7e:
              local_68 = 0xe;
            }
          }
          else {
            if (uVar6 != 0xff) goto switchD_00102c3c_caseD_b;
            local_68 = 0;
          }
        }
        goto LAB_0010316d;
      }
      if (0x36 < uVar6 - 9) {
        if (uVar6 == 0x5b) {
          local_68 = 10;
          goto LAB_0010316d;
        }
switchD_00102c3c_caseD_b:
        uVar10 = (ulong)(uint)(int)(char)bVar2;
        lVar11 = L2_PARSING_ERROR_ILLEGAL_CHARACTER;
LAB_001032db:
        l2_parsing_error(lVar11,iVar5,cols,uVar10);
      }
      plVar7 = (l2_token *)
               ((long)&switchD_00102c3c::switchdataD_0010c494 +
               (long)(int)(&switchD_00102c3c::switchdataD_0010c494)[uVar6 - 9]);
      iVar1 = 0;
      switch(uVar6) {
      case 9:
      case 10:
      case 0xd:
      case 0x20:
        goto switchD_00102c3c_caseD_9;
      default:
        goto switchD_00102c3c_caseD_b;
      case 0x21:
        local_68 = 0xd;
        cVar4 = l2_char_stream_next_char(char_stream_p);
        plVar7 = (l2_token *)CONCAT71(extraout_var_00,cVar4);
        if (cVar4 == '=') {
          local_68 = 0x1e;
        }
        else {
LAB_00103164:
          l2_char_stream_rollback(token_stream_p->char_stream_p);
          plVar7 = extraout_RAX_19;
        }
        break;
      case 0x22:
        local_68 = 5;
        uVar6 = 5;
        goto LAB_0010299a;
      case 0x25:
        local_68 = 0x11;
        cVar4 = l2_char_stream_next_char(char_stream_p);
        plVar7 = (l2_token *)CONCAT71(extraout_var_04,cVar4);
        if (cVar4 != '=') goto LAB_00103164;
        local_68 = 0x2b;
        break;
      case 0x26:
        local_68 = 0x1f;
        bVar2 = l2_char_stream_next_char(char_stream_p);
        plVar7 = (l2_token *)CONCAT71(extraout_var_03,bVar2);
        if (bVar2 == 0x3d) {
          local_68 = 0x2f;
        }
        else {
          plVar7 = (l2_token *)(ulong)bVar2;
          if (bVar2 != 0x26) goto LAB_00103164;
          local_68 = 0x22;
        }
        break;
      case 0x27:
        local_68 = 3;
        uVar6 = 4;
        goto LAB_0010299a;
      case 0x28:
        local_68 = 8;
        break;
      case 0x29:
        local_68 = 9;
        break;
      case 0x2a:
        local_68 = 0xf;
        cVar4 = l2_char_stream_next_char(char_stream_p);
        plVar7 = (l2_token *)CONCAT71(extraout_var_14,cVar4);
        if (cVar4 != '=') goto LAB_00103164;
        local_68 = 0x29;
        break;
      case 0x2b:
        local_68 = 0x12;
        bVar2 = l2_char_stream_next_char(char_stream_p);
        plVar7 = (l2_token *)CONCAT71(extraout_var_08,bVar2);
        if (bVar2 == 0x3d) {
          local_68 = 0x27;
        }
        else {
          plVar7 = (l2_token *)(ulong)bVar2;
          if (bVar2 != 0x2b) goto LAB_00103164;
          local_68 = 0x13;
        }
        break;
      case 0x2c:
        local_68 = 0x32;
        break;
      case 0x2d:
        local_68 = 0x14;
        bVar2 = l2_char_stream_next_char(char_stream_p);
        plVar7 = (l2_token *)CONCAT71(extraout_var_15,bVar2);
        if (bVar2 == 0x3d) {
          local_68 = 0x28;
        }
        else {
          plVar7 = (l2_token *)(ulong)bVar2;
          if (bVar2 != 0x2d) goto LAB_00103164;
          local_68 = 0x15;
        }
        break;
      case 0x2e:
        local_68 = 0xc;
        break;
      case 0x2f:
        local_68 = 0x10;
        cVar4 = l2_char_stream_next_char(char_stream_p);
        plVar7 = (l2_token *)CONCAT71(extraout_var_05,cVar4);
        if (cVar4 == '=') {
          local_68 = 0x2a;
        }
        else {
          if (cVar4 != '/') goto LAB_00103164;
          do {
            bVar2 = l2_char_stream_next_char(token_stream_p->char_stream_p);
            plVar7 = (l2_token *)CONCAT71(extraout_var_06,bVar2);
            if (bVar2 == 10) break;
            plVar7 = (l2_token *)(ulong)bVar2;
          } while (bVar2 != 0xff);
        }
        break;
      case 0x3a:
        local_68 = 0x25;
        break;
      case 0x3b:
        local_68 = 0x33;
        break;
      case 0x3c:
        local_68 = 0x1b;
        cVar4 = l2_char_stream_next_char(char_stream_p);
        plVar7 = (l2_token *)CONCAT71(extraout_var_12,cVar4);
        if (cVar4 != '=') {
          if (cVar4 == '<') {
            local_68 = 0x18;
            cVar4 = l2_char_stream_next_char(token_stream_p->char_stream_p);
            plVar7 = (l2_token *)CONCAT71(extraout_var_13,cVar4);
            if (cVar4 == '=') {
              local_68 = 0x2e;
              break;
            }
          }
          goto LAB_00103164;
        }
        local_68 = 0x1c;
        break;
      case 0x3d:
        local_68 = 0x26;
        cVar4 = l2_char_stream_next_char(char_stream_p);
        plVar7 = (l2_token *)CONCAT71(extraout_var_07,cVar4);
        if (cVar4 != '=') goto LAB_00103164;
        local_68 = 0x1d;
        break;
      case 0x3e:
        local_68 = 0x19;
        cVar4 = l2_char_stream_next_char(char_stream_p);
        plVar7 = (l2_token *)CONCAT71(extraout_var_09,cVar4);
        if (cVar4 != '=') {
          if (cVar4 == '>') {
            local_68 = 0x16;
            cVar4 = l2_char_stream_next_char(token_stream_p->char_stream_p);
            plVar7 = (l2_token *)CONCAT71(extraout_var_10,cVar4);
            if (cVar4 == '=') {
              local_68 = 0x2c;
              break;
            }
            if (cVar4 == '>') {
              local_68 = 0x17;
              cVar4 = l2_char_stream_next_char(token_stream_p->char_stream_p);
              plVar7 = (l2_token *)CONCAT71(extraout_var_11,cVar4);
              if (cVar4 == '=') {
                local_68 = 0x2d;
                break;
              }
            }
          }
          goto LAB_00103164;
        }
        local_68 = 0x1a;
        break;
      case 0x3f:
        local_68 = 0x24;
      }
LAB_0010316d:
      iVar1 = 5;
switchD_00102c3c_caseD_9:
      iVar13 = iVar1;
      uVar6 = 0;
      break;
    case 1:
      if (((((byte)(bVar2 + 0xbf) < 0x1a) || ((byte)(bVar2 - 0x30) < 10)) || (bVar2 == 0x5f)) ||
         ((byte)(bVar2 + 0x9f) < 0x1a)) goto LAB_00102767;
      l2_char_stream_rollback(char_stream_p);
      lVar12 = 0;
      do {
        bVar3 = l2_string_equal_c(&local_80,*(char **)((long)g_l2_token_keywords + lVar12));
        if (bVar3 != '\0') {
          plVar7 = *(l2_token **)((long)g_l2_token_keywords + lVar12);
          goto LAB_00102a30;
        }
        lVar12 = lVar12 + 8;
      } while (lVar12 != 0x70);
      plVar7 = (l2_token *)0x0;
LAB_00102a30:
      if (plVar7 == (l2_token *)0x0) {
        local_68 = 2;
        l2_string_create(&lStack_60);
        l2_string_strcpy(&lStack_60,&local_80);
        plVar7 = extraout_RAX_16;
      }
      else {
        local_68 = 1;
        lStack_60.str_p = (char *)plVar7;
      }
      iVar13 = 5;
      uVar6 = 1;
      break;
    case 2:
      if ((bVar2 & 0xdf) == 0x58) {
        l2_string_push_char(&local_80,bVar2);
        uVar6 = 0x20;
        plVar7 = extraout_RAX_03;
      }
      else {
        if (9 < (byte)(bVar2 - 0x30)) {
          if (bVar2 == 0x2e) goto LAB_00102953;
          lStack_60.str_p = (char *)((ulong)lStack_60.str_p & 0xffffffff00000000);
          l2_char_stream_rollback(char_stream_p);
          iVar13 = 5;
          uVar6 = 2;
          plVar7 = extraout_RAX_15;
          break;
        }
LAB_001027fa:
        if ('7' < (char)bVar2) {
          uVar10 = (ulong)bVar2;
          lVar11 = L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL;
          goto LAB_001032db;
        }
        l2_string_push_char(&local_80,bVar2);
        uVar6 = 0x21;
        plVar7 = extraout_RAX_09;
      }
      goto LAB_00102997;
    case 3:
      if ((byte)(bVar2 - 0x30) < 10) {
LAB_00102741:
        l2_string_push_char(&local_80,bVar2);
        uVar6 = 3;
        plVar7 = extraout_RAX_05;
      }
      else {
        if (bVar2 != 0x2e) {
          pcVar8 = l2_string_get_str_p(&local_80);
          iVar5 = l2_cast_decimal_str_to_int(pcVar8);
          lStack_60.str_p = (char *)CONCAT44(lStack_60.str_p._4_4_,iVar5);
          l2_char_stream_rollback(token_stream_p->char_stream_p);
          iVar13 = 5;
          uVar6 = 3;
          plVar7 = extraout_RAX_10;
          break;
        }
LAB_00102953:
        local_68 = 4;
        l2_string_push_char(&local_80,bVar2);
        uVar6 = 0x31;
        plVar7 = extraout_RAX_13;
      }
LAB_00102997:
      iVar13 = 0;
      break;
    case 4:
      uVar6 = 0x40;
      iVar13 = 0;
      if (bVar2 != 0x5c) {
        if (bVar2 != 0xff) {
          if (bVar2 == 0x27) {
            lVar11 = L2_PARSING_ERROR_EMPTY_CHARACTER_LITERAL;
            goto LAB_001032f3;
          }
          goto LAB_0010260d;
        }
LAB_001032bd:
        lVar11 = L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL;
        goto LAB_001032f3;
      }
      break;
    case 5:
      if (bVar2 == 0x22) {
        l2_string_push_char(&local_80,'\0');
        uVar6 = 5;
        iVar13 = 5;
        plVar7 = extraout_RAX_12;
      }
      else {
LAB_001027c0:
        plVar7 = (l2_token *)(ulong)bVar2;
        uVar6 = 0x50;
        iVar13 = 0;
        if (bVar2 != 0x5c) {
          if (bVar2 != 0xff) goto LAB_001027dd;
LAB_001032e7:
          lVar11 = L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL;
LAB_001032f3:
          l2_parsing_error(lVar11,iVar5,cols);
        }
      }
    }
LAB_0010299a:
    if (iVar13 != 0) {
      if (iVar13 == 5) {
        l2_string_destroy(&local_80);
        l2_vector_append(&token_stream_p->token_vector,&local_68);
        token_stream_p->token_vector_current_pos = token_stream_p->token_vector_current_pos + 1;
        plVar7 = (l2_token *)l2_vector_tail(&token_stream_p->token_vector);
      }
      return plVar7;
    }
  } while( true );
}

Assistant:

l2_token *l2_token_stream_next_token(l2_token_stream *token_stream_p) {
    l2_assert(token_stream_p, L2_INTERNAL_ERROR_NULL_POINTER);

    if (token_stream_p->token_vector_current_pos < token_stream_p->token_vector.size) {
        token_stream_p->token_vector_current_pos += 1;
        return (l2_token *)l2_vector_at(&token_stream_p->token_vector, token_stream_p->token_vector_current_pos - 1);
    }


    l2_token t = { 0 };
    int fa_state = 0x0;
    char ch = 0;
    l2_string token_str_buff;
    l2_string_create(&token_str_buff);

    while(1) {
        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);

        int lines = token_stream_p->char_stream_p->lines;
        int cols = token_stream_p->char_stream_p->cols;

        switch (fa_state) {
            case 0x0:
                t.current_col = cols;
                t.current_line = lines;
                t.current_pos_at_stream = token_stream_p->char_stream_p->chars_vector_current_pos;

                if ((ch >= 'A' && ch <= 'Z') || (ch >= 'a' && ch <= 'z') || ch == '_') {
                    t.type = L2_TOKEN_IDENTIFIER;
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x1;

                } else if (ch == '0') {
                    t.type = L2_TOKEN_INTEGER_LITERAL;
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x2;

                } else if (ch >= '1' && ch <= '9') {
                    t.type = L2_TOKEN_INTEGER_LITERAL;
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x3;

                } else if (ch == '\'') {
                    t.type = L2_TOKEN_INTEGER_LITERAL;
                    fa_state = 0x4;

                } else if (ch == '\"') {
                    t.type = L2_TOKEN_STRING_LITERAL;
                    fa_state = 0x5;

                } else if (ch == '{') {
                    t.type = L2_TOKEN_LBRACE;
                    goto ret;

                } else if (ch == '}') {
                    t.type = L2_TOKEN_RBRACE;
                    goto ret;

                } else if (ch == '(') {
                    t.type = L2_TOKEN_LP;
                    goto ret;

                } else if (ch == ')') {
                    t.type = L2_TOKEN_RP;
                    goto ret;

                } else if (ch == '[') {
                    t.type = L2_TOKEN_LBRACKET;
                    goto ret;

                } else if (ch == ']') {
                    t.type = L2_TOKEN_RBRACKET;
                    goto ret;

                } else if (ch == '.') {
                    t.type = L2_TOKEN_DOT;
                    goto ret;

                } else if (ch == '!') {
                    t.type = L2_TOKEN_LOGIC_NOT;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_NOT_EQUAL;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '~') {
                    t.type = L2_TOKEN_BIT_NOT;
                    goto ret;

                } else if (ch == '*') {
                    t.type = L2_TOKEN_MUL;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_MUL_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '/') {
                    t.type = L2_TOKEN_DIV;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_DIV_ASSIGN;
                    } else if (ch == '/') {
						do {
							ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
						} while (ch != '\n' && ch != EOF);
		    		} else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '%') {
                    t.type = L2_TOKEN_MOD;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_MOD_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '+') {
                    t.type = L2_TOKEN_PLUS;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '+') {
                        t.type = L2_TOKEN_INC;
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_PLUS_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '-') {
                    t.type = L2_TOKEN_SUB;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '-') {
                        t.type = L2_TOKEN_DEC;
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_SUB_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '>') {
                    t.type = L2_TOKEN_GREAT_THAN;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '>') {
                        t.type = L2_TOKEN_RSHIFT;
                        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                        if (ch == '>') {
                            t.type = L2_TOKEN_RSHIFT_UNSIGNED;
                            ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                            if (ch == '=') {
                                t.type = L2_TOKEN_RSHIFT_UNSIGNED_ASSIGN;
                            } else {
                                l2_char_stream_rollback(token_stream_p->char_stream_p);
                            }
                        } else if (ch == '=') {
                            t.type = L2_TOKEN_RSHIFT_ASSIGN;
                        } else {
                            l2_char_stream_rollback(token_stream_p->char_stream_p);
                        }
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_GREAT_EQUAL_THAN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '<') {
                    t.type = L2_TOKEN_LESS_THAN;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '<') {
                        t.type = L2_TOKEN_LSHIFT;
                        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                        if (ch == '=') {
                            t.type = L2_TOKEN_LSHIFT_ASSIGN;
                        } else {
                            l2_char_stream_rollback(token_stream_p->char_stream_p);
                        }
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_LESS_EQUAL_THAN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '=') {
                    t.type = L2_TOKEN_ASSIGN;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_EQUAL;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '&') {
                    t.type = L2_TOKEN_BIT_AND;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '&') {
                        t.type = L2_TOKEN_LOGIC_AND;
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_BIT_AND_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '^') {
                    t.type = L2_TOKEN_BIT_XOR;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_BIT_XOR_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '|') {
                    t.type = L2_TOKEN_BIT_OR;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '|') {
                        t.type = L2_TOKEN_LOGIC_OR;
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_BIT_OR_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '?') {
                    t.type = L2_TOKEN_QM;
                    goto ret;

                } else if (ch == ':') {
                    t.type = L2_TOKEN_COLON;
                    goto ret;

                } else if (ch == ',') {
                    t.type = L2_TOKEN_COMMA;
                    goto ret;

                } else if (ch == ';') {
                    t.type = L2_TOKEN_SEMICOLON;
                    goto ret;

                } else if (l2_char_is_blank(ch)) {

                } else if (ch == L2_EOF) {
                    t.type = L2_TOKEN_TERMINATOR;
                    goto ret;

                } else {
                    l2_parsing_error(L2_PARSING_ERROR_ILLEGAL_CHARACTER, lines, cols, ch);

                }

                break;

            case 0x1: /* handle identifier or keyword */
                if ((ch >= 'A' && ch <= 'Z') || (ch >= 'a' && ch <= 'z') || ch == '_' || (ch >= '0' && ch <= '9')) {
                    l2_string_push_char(&token_str_buff, ch);

                } else {
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    char *keyword_p = l2_token_stream_str_keyword(&token_str_buff);
                    if (keyword_p) {
                        t.type = L2_TOKEN_KEYWORD;
                        //l2_string_destroy(&token_str_buff);
                        t.u.c_str = keyword_p;
                    } else {
                        t.type = L2_TOKEN_IDENTIFIER;
                        l2_string_create(&t.u.str);
                        l2_string_strcpy(&t.u.str, &token_str_buff);
                    }
                    goto ret;

                }
                break;

            case 0x2: /* handle oct and hex number literal ( begin with 0 ) */
                if (ch == 'X' || ch == 'x') {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x20;

                } else if (ch >= '0' && ch <= '9') {
                    if (ch >= '8') {
                        l2_parsing_error(L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL, lines, cols, ch);
                    }
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x21;

				} else if (ch == '.') {
					t.type = L2_TOKEN_REAL_LITERAL;
					l2_string_push_char(&token_str_buff, ch);
					fa_state = 0x31;

				} else { /* get 0 */
                    t.u.integer = 0;
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;

                }
                break;

            case 0x20: /* handle hex number literal */
                if ((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F')) {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x200;

                } else {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_HEX_LITERAL, lines, cols);

                }
                break;

            case 0x200: /* handle hex number literal */
                if ((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F')) {
                    l2_string_push_char(&token_str_buff, ch);

                } else {
                    t.u.integer = l2_cast_hex_str_to_int(&(l2_string_get_str_p(&token_str_buff)[2]));
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;

                }
                break;

            case 0x21: /* handle oct number literal */
                if (ch >= '0' && ch <= '9') {
                    if (ch >= '8') {
                        l2_parsing_error(L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL, lines, cols, ch);
                    }
                    l2_string_push_char(&token_str_buff, ch);

                } else {
                    t.u.integer = l2_cast_octal_str_to_int(&(l2_string_get_str_p(&token_str_buff)[1]));
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;

                }
                break;

            case 0x3: /* handle dec number literal ( begin with 1 ~ 9 ) */
                if (ch >= '0' && ch <= '9') {
                    l2_string_push_char(&token_str_buff, ch);

                } else if (ch == '.') {
                    t.type = L2_TOKEN_REAL_LITERAL;
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x31;

                } else {
                    t.u.integer = l2_cast_decimal_str_to_int(l2_string_get_str_p(&token_str_buff));
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;
                }
                break;

            case 0x31: /* handle real number literal ( begin with 1 ~ 9 ) */
                if (ch >= '0' && ch <= '9') {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x32;

                } else {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_REAL_LITERAL, lines, cols);
                }
                break;

            case 0x32: /* handle real number literal ( begin with 1 ~ 9 ) */
                if (ch >= '0' && ch <= '9') {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x32;

                } else {
                    t.u.real = l2_cast_real_str_to_int(l2_string_get_str_p(&token_str_buff));
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;
                }
                break;

            case 0x4: /* handle character literal */
                if (ch == '\'') {
                    l2_parsing_error(L2_PARSING_ERROR_EMPTY_CHARACTER_LITERAL, lines, cols);

                } else if (ch == '\\') {
                    fa_state = 0x40;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL, lines, cols);

                } else {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x400;

                }
                break;

            case 0x40: /* handle escape character */
                if (ch == 'a') {
                    l2_string_push_char(&token_str_buff, '\a');

                } else if (ch == 'b') {
                    l2_string_push_char(&token_str_buff, '\b');

                } else if (ch == 'f') {
                    l2_string_push_char(&token_str_buff, '\f');

                } else if (ch == 'n') {
                    l2_string_push_char(&token_str_buff, '\n');

                } else if (ch == 'r') {
                    l2_string_push_char(&token_str_buff, '\r');

                } else if (ch == 't') {
                    l2_string_push_char(&token_str_buff, '\t');

                } else if (ch == 'v') {
                    l2_string_push_char(&token_str_buff, '\v');

                } else if (ch == '\\') {
                    l2_string_push_char(&token_str_buff, '\\');

                } else if (ch == '\'') {
                    l2_string_push_char(&token_str_buff, '\'');

                } else if (ch == '\"') {
                    l2_string_push_char(&token_str_buff, '\"');

                } else if (ch == '?') {
                    l2_string_push_char(&token_str_buff, '\?');

                } else if (ch >= '0' && ch <= '7') {
                    char seq[4];
                    int i;
                    for (i = 1; i < 3; i++) {
                        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                        if (ch >= '0' && ch <= '7') {
                            seq[i] = ch;
                        } else {
                            seq[i] = '\0';
                            l2_char_stream_rollback(token_stream_p->char_stream_p);
                            break;
                        }
                    }
                    seq[i] = '\0';
                    l2_string_push_char(&token_str_buff, (char)l2_cast_octal_str_to_int(seq));
                    fa_state = 0x400;
                    break;

                } else if (ch == 'x') {
                    char seq[3];
                    seq[0] = ch = l2_char_stream_next_char(token_stream_p->char_stream_p); seq[1] = '\0';
                    if (!((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F'))) {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                        l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE, lines, cols, seq);
                        l2_string_push_char(&token_str_buff, seq[0]);
                    }

                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if ((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F')) {
                        seq[1] = ch;
                    } else {
                        seq[1] = '\0';
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                        break;
                    }
                    seq[2] = '\0';
                    l2_string_push_char(&token_str_buff, (char)l2_cast_hex_str_to_int(seq));
                    fa_state = 0x400;
                    break;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL, lines, cols);

                } else {
                    char seq[2];
                    seq[0] = ch; seq[1] = '\0';
                    l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE, lines, cols, seq);
                    l2_string_push_char(&token_str_buff, ch);
                }

                fa_state = 0x400;

                break;

            case 0x400:
                if (ch == '\'') {
                    t.u.integer = l2_string_get_str_p(&token_str_buff)[0];
                    goto ret;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL, lines, cols);

                } else {
                    l2_parsing_error(L2_PARSING_ERROR_MULTI_CHARACTER_IN_SINGLE_CHARACTER_LITERAL, lines, cols);

                }
                break;

            case 0x5: /* handle string literal */
                if (ch == '\"') {
                    l2_string_push_char(&token_str_buff, '\0');
                    goto ret;

                } else if (ch == '\\') {
                    fa_state = 0x50;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL, lines, cols);

                } else {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x500;
                }
                break;

            case 0x50: /* handle escape character in string literal */
                if (ch == 'a') {
                    l2_string_push_char(&token_str_buff, '\a');

                } else if (ch == 'b') {
                    l2_string_push_char(&token_str_buff, '\b');

                } else if (ch == 'f') {
                    l2_string_push_char(&token_str_buff, '\f');

                } else if (ch == 'n') {
                    l2_string_push_char(&token_str_buff, '\n');

                } else if (ch == 'r') {
                    l2_string_push_char(&token_str_buff, '\r');

                } else if (ch == 't') {
                    l2_string_push_char(&token_str_buff, '\t');

                } else if (ch == 'v') {
                    l2_string_push_char(&token_str_buff, '\v');

                } else if (ch == '\\') {
                    l2_string_push_char(&token_str_buff, '\\');

                } else if (ch == '\'') {
                    l2_string_push_char(&token_str_buff, '\'');

                } else if (ch == '\"') {
                    l2_string_push_char(&token_str_buff, '\"');

                } else if (ch == '?') {
                    l2_string_push_char(&token_str_buff, '\?');

                } else if (ch >= '0' && ch <= '7') {
                    char seq[4];
                    int i;
                    for (i = 1; i < 3; i++) {
                        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                        if (ch >= '0' && ch <= '7') {
                            seq[i] = ch;
                        } else {
                            seq[i] = '\0';
                            l2_char_stream_rollback(token_stream_p->char_stream_p);
                            break;
                        }
                    }
                    seq[i] = '\0';
                    l2_string_push_char(&token_str_buff, (char)l2_cast_octal_str_to_int(seq));
                    fa_state = 0x500;
                    break;

                } else if (ch == 'x') {
                    char seq[3];
                    seq[0] = ch = l2_char_stream_next_char(token_stream_p->char_stream_p); seq[1] = '\0';
                    if (!((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F'))) {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                        l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE, lines, cols, seq);
                        l2_string_push_char(&token_str_buff, seq[0]);
                    }

                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if ((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F')) {
                        seq[1] = ch;
                    } else {
                        seq[1] = '\0';
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                        l2_string_push_char(&token_str_buff, (char)l2_cast_hex_str_to_int(seq));
                        fa_state = 0x500;
                        break;
                    }
                    seq[2] = '\0';
                    l2_string_push_char(&token_str_buff, (char)l2_cast_hex_str_to_int(seq));
                    fa_state = 0x500;
                    break;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL, lines, cols);

                } else {
                    char seq[2];
                    seq[0] = ch; seq[1] = '\0';
                    l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE, lines, cols, seq);
                    l2_string_push_char(&token_str_buff, ch);
                }

                fa_state = 0x500;
                break;

            case 0x500:
                if (ch == '\"') {
                    l2_string_create(&t.u.str);
                    l2_string_strcpy(&t.u.str, &token_str_buff);
                    goto ret;

                } else if (ch == '\\') {
                    fa_state = 0x50;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL, lines, cols);

                } else {
                    l2_string_push_char(&token_str_buff, ch);
                }
                break;
        }


    }

    ret:

    l2_string_destroy(&token_str_buff);

    l2_vector_append(&token_stream_p->token_vector, &t);
    token_stream_p->token_vector_current_pos += 1;
    return (l2_token *)l2_vector_tail(&token_stream_p->token_vector);
}